

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_pax.c
# Opt level: O0

void test_write_format_pax(void)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  la_ssize_t lVar4;
  time_t tVar5;
  long lVar6;
  char *pcVar7;
  la_int64_t lVar8;
  int local_44c;
  longlong lStack_448;
  int j;
  int64_t length;
  int64_t offset;
  char nulls [1024];
  size_t sStack_30;
  int i;
  size_t used;
  archive *a;
  archive_entry *ae;
  char *buff;
  size_t buffsize;
  
  buff = (char *)0xf4240;
  ae = (archive_entry *)malloc(1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L')',(uint)(ae != (archive_entry *)0x0),"buff != NULL",(void *)0x0);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L',',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_pax((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'-',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax(a)",(void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'.',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",(void *)used);
  iVar1 = archive_write_open_memory((archive *)used,ae,(size_t)buff,&stack0xffffffffffffffd0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'/',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'4',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,2,0x14);
  archive_entry_set_birthtime((archive_entry *)a,3,0x1e);
  archive_entry_set_ctime((archive_entry *)a,4,0x28);
  archive_entry_set_mtime((archive_entry *)a,5,0x32);
  archive_entry_copy_pathname((archive_entry *)a,"file");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar4 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'>',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'C',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,2,0x14);
  archive_entry_set_birthtime((archive_entry *)a,8,0x50);
  archive_entry_set_ctime((archive_entry *)a,4,0x28);
  archive_entry_set_mtime((archive_entry *)a,5,0x32);
  archive_entry_copy_pathname((archive_entry *)a,"file2");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar4 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'M',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'V',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,2,0x14);
  archive_entry_set_birthtime((archive_entry *)a,3,0x1e);
  archive_entry_set_ctime((archive_entry *)a,4,0x28);
  archive_entry_set_mtime((archive_entry *)a,5,0x32);
  archive_entry_copy_pathname
            ((archive_entry *)a,
             "file3_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789"
            );
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,0xfa008);
  archive_entry_sparse_add_entry((archive_entry *)a,0xfa000,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  memset(&offset,0,0x400);
  nulls[0x3fc] = '\0';
  nulls[0x3fd] = '\0';
  nulls[0x3fe] = '\0';
  nulls[0x3ff] = '\0';
  for (; (int)nulls._1020_4_ < 0xfa000; nulls._1020_4_ = nulls._1020_4_ + 0x400) {
    lVar4 = archive_write_data((archive *)used,&offset,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                        ,L'g',0x400,"1024",lVar4,"archive_write_data(a, nulls, 1024)",(void *)used);
  }
  lVar4 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'h',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'n',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,2,0x14);
  archive_entry_set_birthtime((archive_entry *)a,3,0x1e);
  archive_entry_set_ctime((archive_entry *)a,4,0x28);
  archive_entry_set_mtime((archive_entry *)a,5,0x32);
  archive_entry_copy_pathname((archive_entry *)a,"file4");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  archive_entry_copy_uname((archive_entry *)a,"long-uname123456789012345678901234567890");
  archive_entry_copy_gname((archive_entry *)a,"long-gname123456789012345678901234567890");
  archive_entry_set_uid((archive_entry *)a,0x20000000);
  archive_entry_set_gid((archive_entry *)a,0x20000001);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar4 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'~',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)used);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'\x8f',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x90',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x91',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)used);
  iVar1 = archive_read_open_memory((archive *)used,ae,sStack_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x92',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x97',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x98',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  lVar6 = archive_entry_atime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x99',0x14,"20",lVar6,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_birthtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9a',3,"3",tVar5,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar6 = archive_entry_birthtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9b',0x1e,"30",lVar6,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9c',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  lVar6 = archive_entry_ctime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9d',0x28,"40",lVar6,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9e',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9f',0x32,"50",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'\xa0',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'¡',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar8 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¢',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar4 = archive_read_data((archive *)used,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'£',8,"8",lVar4,"archive_read_data(a, buff2, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¤',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'©',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  wVar3 = archive_entry_atime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'ª',wVar3,"archive_entry_atime_is_set(ae)",(void *)0x0);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'«',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  lVar6 = archive_entry_atime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¬',0x14,"20",lVar6,"archive_entry_atime_nsec(ae)",(void *)0x0);
  wVar3 = archive_entry_birthtime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'®',(wVar3 != L'\0' ^ 0xff) & 1,"!archive_entry_birthtime_is_set(ae)",
                   (void *)0x0);
  tVar5 = archive_entry_birthtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¯',0,"0",tVar5,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar6 = archive_entry_birthtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'°',0,"0",lVar6,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  wVar3 = archive_entry_ctime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'±',wVar3,"archive_entry_ctime_is_set(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'²',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  lVar6 = archive_entry_ctime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'³',0x28,"40",lVar6,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  wVar3 = archive_entry_mtime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'´',wVar3,"archive_entry_mtime_is_set(ae)",(void *)0x0);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'µ',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¶',0x32,"50",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'·',"file2","\"file2\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'¸',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar8 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¹',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar4 = archive_read_data((archive *)used,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'º',8,"8",lVar4,"archive_read_data(a, buff2, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'»',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'À',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Á',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  lVar6 = archive_entry_atime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Â',0x14,"20",lVar6,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_birthtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ã',3,"3",tVar5,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar6 = archive_entry_birthtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ä',0x1e,"30",lVar6,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Å',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  lVar6 = archive_entry_ctime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Æ',0x28,"40",lVar6,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ç',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'È',0x32,"50",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'Í',
             "file3_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789"
             ,
             "\"file3\" \"_123456789_123456789_123456789_123456789_123456789\" \"_123456789_123456789_123456789_123456789_123456789\" \"_123456789_123456789_123456789_123456789_123456789\""
             ,pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'Î',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar8 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ï',0xfa008,"1024008",lVar8,"archive_entry_size(ae)",(void *)0x0);
  wVar3 = archive_entry_sparse_reset((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ð',1,"1",(long)wVar3,"archive_entry_sparse_reset(ae)",(void *)0x0);
  wVar3 = archive_entry_sparse_next((archive_entry *)a,&length,&stack0xfffffffffffffbb8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ò',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ó',0xfa000,"1024000",length,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ô',8,"8",lStack_448,"length",(void *)0x0);
  nulls[0x3fc] = '\0';
  nulls[0x3fd] = '\0';
  nulls[0x3fe] = '\0';
  nulls[0x3ff] = '\0';
  for (; (int)nulls._1020_4_ < 0xfa000; nulls._1020_4_ = nulls._1020_4_ + 0x400) {
    lVar4 = archive_read_data((archive *)used,&offset,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                        ,L'×',0x400,"1024",lVar4,"archive_read_data(a, nulls, 1024)",(void *)used);
    for (local_44c = 0; local_44c < 0x400; local_44c = local_44c + 1) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                          ,L'Ù',0,"0",(long)nulls[(long)local_44c + -8],"nulls[j]",(void *)0x0);
    }
  }
  lVar4 = archive_read_data((archive *)used,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Û',8,"8",lVar4,"archive_read_data(a, buff2, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ü',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'á',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'â',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  lVar6 = archive_entry_atime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ã',0x14,"20",lVar6,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_birthtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ä',3,"3",tVar5,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar6 = archive_entry_birthtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'å',0x1e,"30",lVar6,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'æ',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  lVar6 = archive_entry_ctime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ç',0x28,"40",lVar6,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'è',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'é',0x32,"50",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'ê',"file4","\"file4\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar7 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'ì',"long-uname123456789012345678901234567890",
             "\"long-uname123456789012345678901234567890\"",pcVar7,"archive_entry_uname(ae)",
             (void *)0x0,L'\0');
  pcVar7 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'î',"long-gname123456789012345678901234567890",
             "\"long-gname123456789012345678901234567890\"",pcVar7,"archive_entry_gname(ae)",
             (void *)0x0,L'\0');
  lVar8 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ï',0x20000000,"536870912",lVar8,"archive_entry_uid(ae)",(void *)0x0);
  lVar8 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ð',0x20000001,"536870913",lVar8,"archive_entry_gid(ae)",(void *)0x0);
  mVar2 = archive_entry_mode((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'ñ',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar8 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ò',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar4 = archive_read_data((archive *)used,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ó',8,"8",lVar4,"archive_read_data(a, buff2, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ô',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ù',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)used);
  iVar1 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)used);
  iVar1 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'û',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)used);
  free(ae);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_pax)
{
	size_t buffsize = 1000000;
	char *buff;
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int i;
	char nulls[1024];
	int64_t offset, length;

	buff = malloc(buffsize); /* million bytes of work area */
	assert(buff != NULL);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file" has a bunch of attributes and 8 bytes of data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file2" is similar but has birthtime later than mtime.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 8, 80);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file3" is sparse file and has hole size of which is
	 * 1024000 bytes, and has 8 bytes data after the hole.
	 *
	 * Pad the filename to make it larger than the ustar limit.
	 * It should still read back correctly.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file3"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 1024008);
	archive_entry_sparse_add_entry(ae, 1024000, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	memset(nulls, 0, sizeof(nulls));
	for (i = 0; i < 1024000; i += 1024)
		/* write hole data, which won't be stored into an archive file. */
		assertEqualIntA(a, 1024, archive_write_data(a, nulls, 1024));
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file4" is similar to "file1" but has a large uid, large gid,
	 * uname and gname are longer than 32 characters
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file4");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	archive_entry_copy_uname(ae,
	    "long-uname123456789012345678901234567890");
	archive_entry_copy_gname(ae,
	    "long-gname123456789012345678901234567890");
	archive_entry_set_uid(ae, 536870912);
	archive_entry_set_gid(ae, 536870913);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * XXX TODO XXX Archive directory, other file types.
	 * Archive extended attributes, ACLs, other metadata.
	 * Verify they get read back correctly.
	 */

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	/*
	 *
	 * Now, read the data back.
	 *
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read "file"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(30, archive_entry_birthtime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file2"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(archive_entry_atime_is_set(ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	/* Birthtime > mtime above, so it doesn't get stored at all. */
	assert(!archive_entry_birthtime_is_set(ae));
	assertEqualInt(0, archive_entry_birthtime(ae));
	assertEqualInt(0, archive_entry_birthtime_nsec(ae));
	assert(archive_entry_ctime_is_set(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assert(archive_entry_mtime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file3"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(30, archive_entry_birthtime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file3"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789",
	    archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(1024008, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_sparse_reset(ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(1024000, offset);
	assertEqualInt(8, length);
	for (i = 0; i < 1024000; i += 1024) {
		int j;
		assertEqualIntA(a, 1024, archive_read_data(a, nulls, 1024));
		for (j = 0; j < 1024; j++)
			assertEqualInt(0, nulls[j]);
	}
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file4
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(30, archive_entry_birthtime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file4", archive_entry_pathname(ae));
	assertEqualString("long-uname123456789012345678901234567890",
	    archive_entry_uname(ae));
	assertEqualString("long-gname123456789012345678901234567890",
	    archive_entry_gname(ae));
	assertEqualInt(536870912, archive_entry_uid(ae));
	assertEqualInt(536870913, archive_entry_gid(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}